

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer-source.cc
# Opt level: O0

Result __thiscall wabt::LexerSourceFile::Tell(LexerSourceFile *this,Offset *out_offset)

{
  Offset OVar1;
  long offset;
  Offset *out_offset_local;
  LexerSourceFile *this_local;
  
  if (this->file_ == (FILE *)0x0) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    OVar1 = ftell((FILE *)this->file_);
    if ((long)OVar1 < 0) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      *out_offset = OVar1;
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result LexerSourceFile::Tell(Offset* out_offset) {
  if (!file_) {
    return Result::Error;
  }

  long offset = ftell(file_);
  if (offset < 0) {
    return Result::Error;
  }

  *out_offset = offset;
  return Result::Ok;
}